

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsparser.cc
# Opt level: O0

void ctemplate_htmlparser::jsparser_copy(jsparser_ctx *dst,jsparser_ctx *src)

{
  jsparser_ctx *src_local;
  jsparser_ctx *dst_local;
  
  dst->buffer_start = src->buffer_start;
  dst->buffer_end = src->buffer_end;
  *(undefined8 *)dst->buffer = *(undefined8 *)src->buffer;
  *(undefined8 *)(dst->buffer + 8) = *(undefined8 *)(src->buffer + 8);
  *(undefined2 *)(dst->buffer + 0x10) = *(undefined2 *)(src->buffer + 0x10);
  statemachine_copy(dst->statemachine,src->statemachine,dst->statemachine_def,dst);
  return;
}

Assistant:

void jsparser_copy(jsparser_ctx *dst, jsparser_ctx *src)
{

  dst->buffer_start = src->buffer_start;
  dst->buffer_end = src->buffer_end;
  memcpy(dst->buffer, src->buffer, sizeof(src->buffer));

  statemachine_copy(dst->statemachine,
                    src->statemachine,
                    dst->statemachine_def,
                    dst);

}